

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_RipperBlood(AActor *mo,AActor *bleeder)

{
  byte *pbVar1;
  double dVar2;
  PalEntry kind;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  PClassActor *type;
  AActor *pAVar7;
  uint uVar8;
  undefined1 local_58 [16];
  DVector3 pos;
  
  kind = AActor::GetBloodColor(bleeder);
  type = AActor::GetBloodType(bleeder,0);
  iVar3 = FRandom::Random2(&pr_ripperblood);
  iVar4 = FRandom::Random2(&pr_ripperblood);
  iVar5 = FRandom::Random2(&pr_ripperblood);
  AActor::Vec3Offset(&pos,mo,(double)iVar3 * 0.0625,(double)iVar4 * 0.0625,(double)iVar5 * 0.0625,
                     false);
  iVar3 = cl_bloodtype.Value;
  uVar8 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    iVar4 = *(int *)((type->super_PClass).Defaults + 0x198);
    pAVar7 = Spawn(type,&pos,NO_REPLACE);
    if (((pAVar7->flags5).Value & 0x800000) != 0) {
      (pAVar7->target).field_0.p = bleeder;
    }
    if (gameinfo.gametype == GAME_Heretic) {
      pbVar1 = (byte *)((long)&(pAVar7->flags).Value + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    uVar8 = (iVar4 << 4) >> 0x1f & iVar3;
    dVar2 = (mo->Vel).Y;
    (pAVar7->Vel).X = (mo->Vel).X * 0.5;
    (pAVar7->Vel).Y = dVar2 * 0.5;
    uVar6 = FRandom::operator()(&pr_ripperblood);
    pAVar7->tics = pAVar7->tics + (uVar6 & 3);
    if ((kind.field_0 != 0) && (((pAVar7->flags2).Value & 0x10000) == 0)) {
      pAVar7->Translation = (uint)kind.field_0 >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar8) {
      pbVar1 = (byte *)((long)&(pAVar7->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_004c29be;
    }
  }
  if ((int)uVar8 < 1) {
    return;
  }
LAB_004c29be:
  AActor::AngleTo((AActor *)local_58,bleeder,SUB81(mo,0));
  local_58._8_8_ = (double)local_58._0_8_ + 180.0;
  P_DrawSplash2(0x1c,&pos,(DAngle *)(local_58 + 8),0,(int)kind.field_0);
  return;
}

Assistant:

void P_RipperBlood (AActor *mo, AActor *bleeder)
{
	PalEntry bloodcolor = bleeder->GetBloodColor();
	PClassActor *bloodcls = bleeder->GetBloodType();

	double xo = pr_ripperblood.Random2() / 16.;
	double yo = pr_ripperblood.Random2() / 16.;
	double zo = pr_ripperblood.Random2() / 16.;
	DVector3 pos = mo->Vec3Offset(xo, yo, zo);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *th;
		th = Spawn (bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = bleeder;
		if (gameinfo.gametype == GAME_Heretic)
			th->flags |= MF_NOGRAVITY;
		th->Vel.X = mo->Vel.X / 2;
		th->Vel.Y = mo->Vel.Y / 2;
		th->tics += pr_ripperblood () & 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(28, pos, bleeder->AngleTo(mo) + 180., 0, bloodcolor);
	}
}